

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

RepeatedPrimitiveDefaults *
google::protobuf::internal::RepeatedPrimitiveDefaults::default_instance(void)

{
  int iVar1;
  RepeatedPrimitiveDefaults *p;
  
  if (default_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&default_instance()::instance);
    if (iVar1 != 0) {
      p = (RepeatedPrimitiveDefaults *)operator_new(0x70);
      (p->default_repeated_field_bool_).current_size_ = 0;
      (p->default_repeated_field_bool_).total_size_ = 0;
      (p->default_repeated_field_bool_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_float_).current_size_ = 0;
      (p->default_repeated_field_float_).total_size_ = 0;
      (p->default_repeated_field_float_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_double_).current_size_ = 0;
      (p->default_repeated_field_double_).total_size_ = 0;
      (p->default_repeated_field_double_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_uint64_).current_size_ = 0;
      (p->default_repeated_field_uint64_).total_size_ = 0;
      (p->default_repeated_field_uint64_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_uint32_).current_size_ = 0;
      (p->default_repeated_field_uint32_).total_size_ = 0;
      (p->default_repeated_field_uint32_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_int64_).current_size_ = 0;
      (p->default_repeated_field_int64_).total_size_ = 0;
      (p->default_repeated_field_int64_).arena_or_elements_ = (void *)0x0;
      (p->default_repeated_field_int32_).current_size_ = 0;
      (p->default_repeated_field_int32_).total_size_ = 0;
      (p->default_repeated_field_int32_).arena_or_elements_ = (void *)0x0;
      default_instance::instance =
           OnShutdownDelete<google::protobuf::internal::RepeatedPrimitiveDefaults>(p);
      __cxa_guard_release(&default_instance()::instance);
    }
  }
  return default_instance::instance;
}

Assistant:

const RepeatedPrimitiveDefaults* RepeatedPrimitiveDefaults::default_instance() {
  static auto instance = OnShutdownDelete(new RepeatedPrimitiveDefaults);
  return instance;
}